

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

GCtab * lj_tab_new(lua_State *L,uint32_t asize,uint32_t hbits)

{
  uint uVar1;
  uint uVar2;
  GCtab *pGVar3;
  long lVar4;
  GCtab *t;
  TValue *array;
  uint32_t asize_1;
  uint32_t i;
  Node *n;
  Node *node;
  uint32_t hmask;
  uint32_t i_1;
  uint32_t in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  lua_State *in_stack_ffffffffffffffb0;
  uint local_2c;
  uint local_c;
  
  pGVar3 = newtab(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  uVar1 = pGVar3->asize;
  uVar2 = (pGVar3->array).ptr32;
  for (local_2c = 0; local_2c < uVar1; local_2c = local_2c + 1) {
    *(undefined4 *)((ulong)uVar2 + 4 + (ulong)local_2c * 8) = 0xffffffff;
  }
  if (pGVar3->hmask != 0) {
    uVar1 = pGVar3->hmask;
    uVar2 = (pGVar3->node).ptr32;
    for (local_c = 0; local_c <= uVar1; local_c = local_c + 1) {
      lVar4 = (ulong)uVar2 + (ulong)local_c * 0x18;
      *(undefined4 *)(lVar4 + 0x10) = 0;
      *(undefined4 *)(lVar4 + 0xc) = 0xffffffff;
      *(undefined4 *)(lVar4 + 4) = 0xffffffff;
    }
  }
  return pGVar3;
}

Assistant:

GCtab *lj_tab_new(lua_State *L, uint32_t asize, uint32_t hbits)
{
  GCtab *t = newtab(L, asize, hbits);
  clearapart(t);
  if (t->hmask > 0) clearhpart(t);
  return t;
}